

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  string_view *sv;
  char *pcVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  Compilation *this_00;
  Type *pTVar7;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  long lVar8;
  uint uVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  SymbolKind SVar16;
  ClassType *pCVar17;
  Diagnostic *pDVar18;
  SubroutineSymbol *pSVar19;
  uint64_t uVar20;
  TransparentMemberSymbol *pTVar21;
  Symbol *pSVar22;
  SubroutineSymbol *derivedMethod;
  SubroutineSymbol *pSVar23;
  byte bVar24;
  SourceLocation SVar25;
  ClassType *pCVar26;
  MethodPrototypeSymbol *this_02;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  DiagCode code_03;
  ulong uVar27;
  long lVar28;
  MethodPrototypeSymbol *args;
  ulong uVar29;
  Scope *pSVar30;
  Scope *this_03;
  Symbol *member;
  undefined1 auVar31 [16];
  SourceRange SVar32;
  
  this_00 = ((context->scope).ptr)->compilation;
  pCVar17 = Lookup::findClass((extendsClause->baseName).ptr,context,(optional<slang::DiagCode>)0x0);
  if (pCVar17 == (ClassType *)0x0) {
LAB_00759143:
    this->baseClass = this_00->errorType;
    return;
  }
  if (pCVar17->isInterface == true) {
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x39;
  }
  else {
    pCVar26 = pCVar17;
    if (pCVar17->isFinal == false) {
      do {
        if (pCVar26 == this) {
          SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          pDVar18 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar32);
          Diagnostic::operator<<(pDVar18,(this->super_Type).super_Symbol.name);
          goto LAB_00759143;
        }
        if ((pCVar26->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar26->super_Scope);
        }
        pTVar7 = pCVar26->baseClass;
        if (pTVar7 == (Type *)0x0) break;
        pCVar26 = (ClassType *)pTVar7->canonical;
        if (pCVar26 == (ClassType *)0x0) {
          Type::resolveCanonical(pTVar7);
          pCVar26 = (ClassType *)pTVar7->canonical;
        }
      } while ((pCVar26->super_Type).super_Symbol.kind != ErrorType);
      this->baseClass = &pCVar17->super_Type;
      if ((this->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&this->super_Scope);
      }
      this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (this->super_Scope).nameMap;
      this_03 = &pCVar17->super_Scope;
      if ((pCVar17->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(this_03);
      }
      this_02 = (MethodPrototypeSymbol *)(pCVar17->super_Scope).firstMember;
      if (this_02 != (MethodPrototypeSymbol *)0x0) {
        bVar13 = false;
        do {
          if ((this_02->super_Symbol).name._M_len != 0) {
            SVar16 = (this_02->super_Symbol).kind;
            if (SVar16 == MethodPrototype) {
              if ((*(byte *)&(this_02->flags).m_bits & 8) == 0) goto LAB_00759209;
              pSVar19 = MethodPrototypeSymbol::getSubroutine(this_02);
              this->baseConstructor = &pSVar19->super_Symbol;
            }
            else if ((SVar16 == Subroutine) && ((this_02->field_0xc4 & 8) != 0)) {
              this->baseConstructor = &this_02->super_Symbol;
            }
            else {
LAB_00759209:
              sv = &(this_02->super_Symbol).name;
              uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (this_01,sv);
              uVar27 = uVar20 >> ((byte)*this_01 & 0x3f);
              lVar28 = (uVar20 & 0xff) * 4;
              cVar10 = (&UNK_0092f4ac)[lVar28];
              cVar11 = (&UNK_0092f4ad)[lVar28];
              cVar12 = (&UNK_0092f4ae)[lVar28];
              bVar3 = (&UNK_0092f4af)[lVar28];
              uVar29 = 0;
              do {
                lVar28 = *(long *)(this_01 + 0x10);
                pcVar1 = (char *)(lVar28 + uVar27 * 0x10);
                bVar24 = pcVar1[0xf];
                auVar31[0] = -(*pcVar1 == cVar10);
                auVar31[1] = -(pcVar1[1] == cVar11);
                auVar31[2] = -(pcVar1[2] == cVar12);
                auVar31[3] = -(pcVar1[3] == bVar3);
                auVar31[4] = -(pcVar1[4] == cVar10);
                auVar31[5] = -(pcVar1[5] == cVar11);
                auVar31[6] = -(pcVar1[6] == cVar12);
                auVar31[7] = -(pcVar1[7] == bVar3);
                auVar31[8] = -(pcVar1[8] == cVar10);
                auVar31[9] = -(pcVar1[9] == cVar11);
                auVar31[10] = -(pcVar1[10] == cVar12);
                auVar31[0xb] = -(pcVar1[0xb] == bVar3);
                auVar31[0xc] = -(pcVar1[0xc] == cVar10);
                auVar31[0xd] = -(pcVar1[0xd] == cVar11);
                auVar31[0xe] = -(pcVar1[0xe] == cVar12);
                auVar31[0xf] = -(bVar24 == bVar3);
                uVar15 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
                if (uVar15 != 0) {
                  lVar8 = *(long *)(this_01 + 0x18);
                  do {
                    uVar9 = 0;
                    if (uVar15 != 0) {
                      for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                      }
                    }
                    bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                             operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)this_01,sv,
                                        (basic_string_view<char,_std::char_traits<char>_> *)
                                        (lVar8 + uVar27 * 0x168 + (ulong)uVar9 * 0x18));
                    if (bVar14) goto LAB_007591fb;
                    uVar15 = uVar15 - 1 & uVar15;
                  } while (uVar15 != 0);
                  bVar24 = *(byte *)(lVar28 + uVar27 * 0x10 + 0xf);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar24) == 0)
                break;
                lVar28 = uVar27 + uVar29;
                uVar29 = uVar29 + 1;
                uVar27 = lVar28 + 1U & *(ulong *)(this_01 + 8);
              } while (uVar29 <= *(ulong *)(this_01 + 8));
              args = this_02;
              if ((this_02->super_Symbol).kind == TransparentMember) {
                args = (MethodPrototypeSymbol *)(this_02->super_Scope).compilation;
              }
              if (this->isAbstract == false) {
                SVar16 = (args->super_Symbol).kind;
                if (SVar16 == MethodPrototype) {
                  if ((*(byte *)&(args->flags).m_bits & 2) == 0) {
                    SVar16 = (args->super_Symbol).kind;
                    goto LAB_0075935f;
                  }
                  if (bVar13) goto LAB_007591fb;
                  SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
                  code_00.subsystem = Declarations;
                  code_00.code = 0x4b;
                }
                else {
LAB_0075935f:
                  if ((SVar16 != ConstraintBlock) ||
                     (((ulong)(args->declaredReturnType).type & 2) == 0)) goto LAB_0075936d;
                  if (bVar13) goto LAB_007591fb;
                  SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
                  code_00.subsystem = Declarations;
                  code_00.code = 0x4c;
                }
                pDVar18 = ASTContext::addDiag(context,code_00,SVar32);
                Diagnostic::operator<<(pDVar18,(this->super_Type).super_Symbol.name);
                Diagnostic::operator<<(pDVar18,(pCVar17->super_Type).super_Symbol.name);
                Diagnostic::operator<<(pDVar18,(args->super_Symbol).name);
                Diagnostic::addNote(pDVar18,(DiagCode)0x50001,(args->super_Symbol).location);
                bVar13 = true;
              }
              else {
LAB_0075936d:
                pTVar21 = BumpAllocator::
                          emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                    (&this_00->super_BumpAllocator,&args->super_Symbol);
                (*insertCB.callback)(insertCB.callable,&pTVar21->super_Symbol);
              }
            }
          }
LAB_007591fb:
          this_02 = (MethodPrototypeSymbol *)(this_02->super_Symbol).nextInScope;
        } while (this_02 != (MethodPrototypeSymbol *)0x0);
      }
      if ((this->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&this->super_Scope);
      }
      pSVar19 = (SubroutineSymbol *)(this->super_Scope).firstMember;
      do {
        if (pSVar19 == (SubroutineSymbol *)0x0) {
          return;
        }
        SVar16 = (pSVar19->super_Symbol).kind;
        if (SVar16 == Subroutine) {
          if (((pSVar19->flags).m_bits & 0xc) == 0) {
            pSVar23 = (SubroutineSymbol *)Scope::find(this_03,(pSVar19->super_Symbol).name);
            pCVar26 = pCVar17;
            pSVar30 = this_03;
            while (pSVar23 == (SubroutineSymbol *)0x0) {
              if ((pCVar26->super_Scope).deferredMemberIndex != Invalid) {
                Scope::elaborate(pSVar30);
              }
              pTVar7 = pCVar26->baseClass;
              if (pTVar7 == (Type *)0x0) goto LAB_0075980d;
              pCVar26 = (ClassType *)pTVar7->canonical;
              if (pCVar26 == (ClassType *)0x0) {
                Type::resolveCanonical(pTVar7);
                pCVar26 = (ClassType *)pTVar7->canonical;
              }
              if ((pCVar26->super_Type).super_Symbol.kind == ErrorType) goto LAB_00759955;
              pSVar30 = &pCVar26->super_Scope;
              pSVar23 = (SubroutineSymbol *)Scope::find(pSVar30,(pSVar19->super_Symbol).name);
            }
            if ((pSVar23->super_Symbol).kind == Subroutine) {
              uVar5 = (pSVar19->flags).m_bits;
              uVar6 = (pSVar23->flags).m_bits;
              if (((uVar5 >> 0xd & 1) == 0) ||
                 (((uVar6 & 0x4001) == 0 && (pSVar23->overrides == (SubroutineSymbol *)0x0)))) {
                if ((short)uVar6 < 0) {
                  SVar25 = (pSVar19->super_Symbol).location;
                  code_03.subsystem = Declarations;
                  code_03.code = 0x91;
                  goto LAB_00759905;
                }
                if ((((uVar5 >> 0xe & 1) != 0) && ((uVar6 & 0x4001) == 0)) &&
                   (pSVar23->overrides == (SubroutineSymbol *)0x0)) {
                  pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                                (pSVar19->super_Symbol).location);
                  Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
                }
              }
              else {
                SVar25 = (pSVar19->super_Symbol).location;
                code_03.subsystem = Declarations;
                code_03.code = 0x92;
LAB_00759905:
                pDVar18 = ASTContext::addDiag(context,code_03,SVar25);
                Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
                Diagnostic::addNote(pDVar18,(DiagCode)0x50001,(pSVar23->super_Symbol).location);
              }
              if ((((pSVar23->flags).m_bits & 0x4001) != 0) ||
                 (pSVar23->overrides != (SubroutineSymbol *)0x0)) {
                SubroutineSymbol::setOverride(pSVar19,pSVar23);
              }
            }
            else {
LAB_0075980d:
              bVar3 = *(byte *)((long)&(pSVar19->flags).m_bits + 1);
joined_r0x00759815:
              if ((bVar3 & 0x40) != 0) {
                pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                              (pSVar19->super_Symbol).location);
                Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
              }
            }
          }
        }
        else {
          if (SVar16 != MethodPrototype) {
            if (SVar16 == ConstraintBlock) {
              pSVar22 = Scope::find(this_03,(pSVar19->super_Symbol).name);
              pCVar26 = pCVar17;
              pSVar30 = this_03;
              while (pSVar22 == (Symbol *)0x0) {
                if ((pCVar26->super_Scope).deferredMemberIndex != Invalid) {
                  Scope::elaborate(pSVar30);
                }
                pTVar7 = pCVar26->baseClass;
                if (pTVar7 == (Type *)0x0) goto LAB_00759634;
                pCVar26 = (ClassType *)pTVar7->canonical;
                if (pCVar26 == (ClassType *)0x0) {
                  Type::resolveCanonical(pTVar7);
                  pCVar26 = (ClassType *)pTVar7->canonical;
                }
                if ((pCVar26->super_Type).super_Symbol.kind == ErrorType) goto LAB_00759634;
                pSVar30 = &pCVar26->super_Scope;
                pSVar22 = Scope::find(pSVar30,(pSVar19->super_Symbol).name);
              }
              if (pSVar22->kind != ConstraintBlock) {
LAB_00759634:
                bVar3 = *(byte *)&(pSVar19->declaredReturnType).type;
                goto joined_r0x00759815;
              }
              uVar2 = (undefined1)pSVar22[2].kind;
              if (((uVar2 & Definition) != Unknown) &&
                 ((byte)(uVar2 & DeferredMember) >> 2 !=
                  (*(byte *)&(pSVar19->declaredReturnType).type & 4) >> 2)) {
                pDVar18 = ASTContext::addDiag(context,(DiagCode)0x790006,
                                              (pSVar19->super_Symbol).location);
                Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar22->location);
              }
              if (((ulong)(pSVar19->declaredReturnType).type & 0x20) == 0) {
                if (-1 < (char)pSVar22[2].kind) goto LAB_00759955;
                SVar25 = (pSVar19->super_Symbol).location;
                code_01.subsystem = Declarations;
                code_01.code = 0x91;
              }
              else {
                SVar25 = (pSVar19->super_Symbol).location;
                code_01.subsystem = Declarations;
                code_01.code = 0x92;
              }
              pDVar18 = ASTContext::addDiag(context,code_01,SVar25);
              Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
              Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar22->location);
            }
            goto LAB_00759955;
          }
          if ((pSVar19->visibility & 0xc) == Public) {
            pSVar22 = Scope::find(this_03,(pSVar19->super_Symbol).name);
            pCVar26 = pCVar17;
            pSVar30 = this_03;
            while (pSVar22 == (Symbol *)0x0) {
              if ((pCVar26->super_Scope).deferredMemberIndex != Invalid) {
                Scope::elaborate(pSVar30);
              }
              pTVar7 = pCVar26->baseClass;
              if (pTVar7 == (Type *)0x0) goto LAB_007597d9;
              pCVar26 = (ClassType *)pTVar7->canonical;
              if (pCVar26 == (ClassType *)0x0) {
                Type::resolveCanonical(pTVar7);
                pCVar26 = (ClassType *)pTVar7->canonical;
              }
              if ((pCVar26->super_Type).super_Symbol.kind == ErrorType) goto LAB_007594fc;
              pSVar30 = &pCVar26->super_Scope;
              pSVar22 = Scope::find(pSVar30,(pSVar19->super_Symbol).name);
            }
            if (pSVar22->kind == Subroutine) {
              uVar4 = (undefined2)pSVar19->visibility;
              uVar5 = *(ushort *)&pSVar22[3].field_0x4;
              if ((((ushort)uVar4 >> 0xd & 1) == 0) ||
                 (((uVar5 & 0x4001) == 0 && (pSVar22[4].name._M_len == 0)))) {
                if ((short)uVar5 < 0) {
                  SVar25 = (pSVar19->super_Symbol).location;
                  code_02.subsystem = Declarations;
                  code_02.code = 0x91;
                  goto LAB_007598a4;
                }
                if (((((ushort)uVar4 >> 0xe & 1) != 0) && ((uVar5 & 0x4001) == 0)) &&
                   (pSVar22[4].name._M_len == 0)) {
                  pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                                (pSVar19->super_Symbol).location);
                  Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
                }
              }
              else {
                SVar25 = (pSVar19->super_Symbol).location;
                code_02.subsystem = Declarations;
                code_02.code = 0x92;
LAB_007598a4:
                pDVar18 = ASTContext::addDiag(context,code_02,SVar25);
                Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
                Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar22->location);
              }
              if (((*(ushort *)&pSVar22[3].field_0x4 & 0x4001) != 0) ||
                 (pSVar22[4].name._M_len != 0)) {
                (pSVar19->blocks)._M_extent._M_extent_value = (size_t)pSVar22;
              }
            }
            else {
LAB_007597d9:
              if ((pSVar19->visibility & 0x4000) != Public) {
                pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                              (pSVar19->super_Symbol).location);
                Diagnostic::operator<<(pDVar18,(pSVar19->super_Symbol).name);
              }
            }
          }
LAB_007594fc:
          pSVar23 = (SubroutineSymbol *)(pSVar19->blocks)._M_extent._M_extent_value;
          if ((pSVar23 != (SubroutineSymbol *)0x0) &&
             (derivedMethod = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar19)
             , derivedMethod != (SubroutineSymbol *)0x0)) {
            SubroutineSymbol::checkVirtualMethodMatch
                      ((context->scope).ptr,pSVar23,derivedMethod,true);
          }
        }
LAB_00759955:
        pSVar19 = (SubroutineSymbol *)(pSVar19->super_Symbol).nextInScope;
      } while( true );
    }
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x38;
  }
  pDVar18 = ASTContext::addDiag(context,code,SVar32);
  Diagnostic::operator<<(pDVar18,(pCVar17->super_Type).super_Symbol.name);
  return;
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    if (baseType->isFinal) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendFromFinal, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags.has(MethodFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.flags.has(ConstraintBlockFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkOverrideSpecifiers = [&](auto& base, auto& derived) {
        if (derived.flags.has(MethodFlags::Initial) && base.isVirtual()) {
            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (base.flags.has(MethodFlags::Final)) {
            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (!base.isVirtual() && derived.flags.has(MethodFlags::Extends)) {
            context.addDiag(diag::OverridingExtends, derived.location) << derived.name;
        }
    };

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    checkOverrideSpecifiers(baseSub, member);
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                    return;
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase)
                break;

            if (possibleBase->isError())
                return;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }

        // No base method found; if our member is marked 'extends' it's an error.
        if (member.flags.has(MethodFlags::Extends))
            context.addDiag(diag::OverridingExtends, member.location) << member.name;
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine) {
            checkForOverride(member.as<SubroutineSymbol>());
        }
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            bool isOverridden = false;
            auto currentBase = baseType;
            auto& derived = member.as<ConstraintBlockSymbol>();
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        isOverridden = true;
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.flags.has(ConstraintBlockFlags::Pure) &&
                            baseConstraint.flags.has(ConstraintBlockFlags::Static) !=
                                member.as<ConstraintBlockSymbol>().flags.has(
                                    ConstraintBlockFlags::Static)) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }

                        if (derived.flags.has(ConstraintBlockFlags::Initial)) {
                            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                        else if (baseConstraint.flags.has(ConstraintBlockFlags::Final)) {
                            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }

            if (!isOverridden && derived.flags.has(ConstraintBlockFlags::Extends))
                context.addDiag(diag::OverridingExtends, member.location) << member.name;
        }
    }
}